

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall FPolyObj::LinkPolyobj(FPolyObj *this)

{
  uint uVar1;
  vertex_t *pvVar2;
  int iVar3;
  polyblock_t **pppVar4;
  polyblock_t *ppVar5;
  polyblock_t *ppVar6;
  uint i;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  DVector2 local_48;
  
  (this->Bounds).m_Box[2] = 3.4028234663852886e+38;
  (this->Bounds).m_Box[3] = -3.4028234663852886e+38;
  (this->Bounds).m_Box[0] = -3.4028234663852886e+38;
  (this->Bounds).m_Box[1] = 3.4028234663852886e+38;
  for (uVar8 = 0; uVar8 < (this->Sidedefs).Count; uVar8 = uVar8 + 1) {
    pvVar2 = (this->Sidedefs).Array[uVar8]->linedef->v1;
    local_48.X = (pvVar2->p).X;
    local_48.Y = (pvVar2->p).Y;
    FBoundingBox::AddToBox(&this->Bounds,&local_48);
    pvVar2 = (this->Sidedefs).Array[uVar8]->linedef->v2;
    local_48.X = (pvVar2->p).X;
    local_48.Y = (pvVar2->p).Y;
    FBoundingBox::AddToBox(&this->Bounds,&local_48);
  }
  uVar12 = (uint)(((this->Bounds).m_Box[2] - bmaporgx) * 0.0078125);
  iVar13 = (int)(((this->Bounds).m_Box[3] - bmaporgx) * 0.0078125);
  iVar10 = (int)(((this->Bounds).m_Box[0] - bmaporgy) * 0.0078125);
  iVar11 = (int)(((this->Bounds).m_Box[1] - bmaporgy) * 0.0078125);
  *(ulong *)this->bbox = CONCAT44(iVar11,iVar10);
  *(ulong *)(this->bbox + 2) = CONCAT44(iVar13,uVar12);
  iVar3 = bmapwidth;
  uVar7 = iVar11 * bmapwidth;
  iVar10 = iVar10 * bmapwidth;
  do {
    if (iVar10 < (int)uVar7) {
      return;
    }
    iVar11 = bmapheight * iVar3;
    for (uVar9 = uVar12; pppVar4 = PolyBlockMap, (int)uVar9 <= iVar13; uVar9 = uVar9 + 1) {
      if (((-1 < (int)(uVar9 | uVar7)) && ((int)uVar9 < iVar3)) && ((int)uVar7 < iVar11)) {
        uVar1 = uVar9 + uVar7;
        ppVar5 = PolyBlockMap[uVar1];
        if (PolyBlockMap[uVar1] == (polyblock_t *)0x0) {
          ppVar5 = (polyblock_t *)operator_new(0x18);
          pppVar4[uVar1] = ppVar5;
          ppVar5->next = (polyblock_t *)0x0;
          pppVar4[uVar1]->prev = (polyblock_t *)0x0;
          ppVar6 = pppVar4[uVar1];
        }
        else {
          do {
            ppVar6 = ppVar5;
            if (ppVar6->next == (polyblock_t *)0x0) {
              if (ppVar6->polyobj != (FPolyObj *)0x0) {
                ppVar5 = (polyblock_t *)operator_new(0x18);
                ppVar6->next = ppVar5;
                ppVar5->next = (polyblock_t *)0x0;
                ppVar5 = ppVar6->next;
                ppVar5->prev = ppVar6;
                ppVar6 = ppVar5;
              }
              break;
            }
            ppVar5 = ppVar6->next;
          } while (ppVar6->polyobj != (FPolyObj *)0x0);
        }
        ppVar6->polyobj = this;
      }
    }
    uVar7 = uVar7 + iVar3;
  } while( true );
}

Assistant:

void FPolyObj::LinkPolyobj ()
{
	polyblock_t **link;
	polyblock_t *tempLink;

	// calculate the polyobj bbox
	Bounds.ClearBox();
	for(unsigned i = 0; i < Sidedefs.Size(); i++)
	{
		vertex_t *vt;
		
		vt = Sidedefs[i]->linedef->v1;
		Bounds.AddToBox(vt->fPos());
		vt = Sidedefs[i]->linedef->v2;
		Bounds.AddToBox(vt->fPos());
	}
	bbox[BOXRIGHT] = GetBlockX(Bounds.Right());
	bbox[BOXLEFT] = GetBlockX(Bounds.Left());
	bbox[BOXTOP] = GetBlockY(Bounds.Top());
	bbox[BOXBOTTOM] = GetBlockY(Bounds.Bottom());
	// add the polyobj to each blockmap section
	for(int j = bbox[BOXBOTTOM]*bmapwidth; j <= bbox[BOXTOP]*bmapwidth;
		j += bmapwidth)
	{
		for(int i = bbox[BOXLEFT]; i <= bbox[BOXRIGHT]; i++)
		{
			if(i >= 0 && i < bmapwidth && j >= 0 && j < bmapheight*bmapwidth)
			{
				link = &PolyBlockMap[j+i];
				if(!(*link))
				{ // Create a new link at the current block cell
					*link = new polyblock_t;
					(*link)->next = NULL;
					(*link)->prev = NULL;
					(*link)->polyobj = this;
					continue;
				}
				else
				{
					tempLink = *link;
					while(tempLink->next != NULL && tempLink->polyobj != NULL)
					{
						tempLink = tempLink->next;
					}
				}
				if(tempLink->polyobj == NULL)
				{
					tempLink->polyobj = this;
					continue;
				}
				else
				{
					tempLink->next = new polyblock_t;
					tempLink->next->next = NULL;
					tempLink->next->prev = tempLink;
					tempLink->next->polyobj = this;
				}
			}
			// else, don't link the polyobj, since it's off the map
		}
	}
}